

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::CloseUpvalue(void **upvalueList,void *variable,int offset,int size)

{
  long *plVar1;
  long *plVar2;
  
  if (upvalueList == (void **)0x0 || variable == (void *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    return;
  }
  plVar1 = (long *)*upvalueList;
  if (plVar1 != (long *)0x0) {
    plVar2 = plVar1;
    do {
      plVar1 = plVar2;
      if ((void *)*plVar2 != variable) break;
      plVar1 = (long *)plVar2[1];
      memcpy((void *)((long)plVar2 + (long)offset),variable,(ulong)(uint)size);
      *plVar2 = (long)plVar2 + (long)offset;
      plVar2[1] = 0;
      plVar2 = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  *upvalueList = plVar1;
  return;
}

Assistant:

void NULLC::CloseUpvalue(void **upvalueList, void *variable, int offset, int size)
{
	if (!upvalueList || !variable)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}

	struct Upvalue
	{
		void *target;
		Upvalue *next;
	};

	Upvalue *upvalue = (Upvalue*)ReadVmMemoryPointer(upvalueList);

	while (upvalue && ReadVmMemoryPointer(&upvalue->target) == variable)
	{
		Upvalue *next = (Upvalue*)ReadVmMemoryPointer(&upvalue->next);

		char *copy = (char*)upvalue + offset;
		memcpy(copy, variable, unsigned(size));
		WriteVmMemoryPointer(&upvalue->target, copy);
		WriteVmMemoryPointer(&upvalue->next, NULL);

		upvalue = next;
	}

	WriteVmMemoryPointer(upvalueList, upvalue);
}